

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.h
# Opt level: O3

void __thiscall FBX::Material::Material(Material *this,Node *node)

{
  string *psVar1;
  pointer pcVar2;
  size_t __n;
  double dVar3;
  int iVar4;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar5;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar6;
  pointer pNVar7;
  Vector3 VVar8;
  Node properties;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  long local_e8 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_d8;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_c0;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  size_t local_60;
  long local_58 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_48;
  
  pvVar5 = std::
           get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     ((node->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  (this->super_Object).id = *pvVar5;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ShadingModel","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"phong","");
  local_a8.field_2._M_allocated_capacity = 0x69747265706f7250;
  local_a8.field_2._8_4_ = 0x30377365;
  local_a8._M_string_length = 0xc;
  local_a8.field_2._M_local_buf[0xc] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  findNodes(&local_48,
            (FBX *)(node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start,
            (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,&local_a8);
  local_108._0_8_ =
       (local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyCount;
  local_108._8_4_ =
       (undefined4)
       (local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyLength;
  local_108._12_4_ =
       *(undefined4 *)
        ((long)&(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->propertyLength + 4);
  psVar1 = (string *)(local_108 + 0x10);
  local_f8._M_allocated_capacity = (size_type)local_e8;
  pcVar2 = ((local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (psVar1,pcVar2,
             pcVar2 + ((local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_d8,
             &(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_c0,
           &(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  pNVar7 = local_d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pNVar7 == local_d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      (this->shadingModel)._M_dataplus._M_p = (pointer)&(this->shadingModel).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&this->shadingModel,local_88,local_80 + (long)local_88);
LAB_0010ae26:
      std::
      vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_c0);
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_d8);
      if ((long *)local_f8._M_allocated_capacity != local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,local_e8[0] + 1);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"EmissiveFactor","");
      local_a8._M_dataplus._M_p = (pointer)0x0;
      dVar3 = getProperty<double>(node,(string *)local_108,(double *)&local_a8);
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->emissiveFactor = dVar3;
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"AmbientColor","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->ambientColor).x = (float)(int)VVar8._0_8_;
      (this->ambientColor).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->ambientColor).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"DiffuseColor","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->diffuseColor).x = (float)(int)VVar8._0_8_;
      (this->diffuseColor).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->diffuseColor).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"TransparentColor","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->transparentColor).x = (float)(int)VVar8._0_8_;
      (this->transparentColor).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->transparentColor).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"SpecularColor","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->specularColor).x = (float)(int)VVar8._0_8_;
      (this->specularColor).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->specularColor).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"ShininessExponent","");
      local_a8._M_dataplus._M_p = (pointer)0x4000000000000000;
      dVar3 = getProperty<double>(node,(string *)local_108,(double *)&local_a8);
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->shininessExponent = dVar3;
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Emissive","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->emissive).x = (float)(int)VVar8._0_8_;
      (this->emissive).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->emissive).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Ambient","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->ambient).x = (float)(int)VVar8._0_8_;
      (this->ambient).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->ambient).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Diffuse","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->diffuse).x = (float)(int)VVar8._0_8_;
      (this->diffuse).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->diffuse).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Specular","");
      local_a8._M_string_length = local_a8._M_string_length & 0xffffffff00000000;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      VVar8 = getProperty(node,(string *)local_108,(Vector3 *)&local_a8);
      (this->specular).x = (float)(int)VVar8._0_8_;
      (this->specular).y = (float)(int)((ulong)VVar8._0_8_ >> 0x20);
      (this->specular).z = VVar8.z;
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Shininess","");
      local_a8._M_dataplus._M_p = (pointer)0x4000000000000000;
      dVar3 = getProperty<double>(node,(string *)local_108,(double *)&local_a8);
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->shininess = dVar3;
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Opacity","");
      local_a8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      dVar3 = getProperty<double>(node,(string *)local_108,(double *)&local_a8);
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->opacity = dVar3;
      local_108._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Reflectivity","");
      local_a8._M_dataplus._M_p = (pointer)0x0;
      dVar3 = getProperty<double>(node,(string *)local_108,(double *)&local_a8);
      if ((string *)local_108._0_8_ != psVar1) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->reflectivity = dVar3;
      return;
    }
    pvVar6 = std::
             get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       ((pNVar7->properties).
                        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    __n = pvVar6->_M_string_length;
    if (__n == local_60) {
      if (__n != 0) {
        iVar4 = bcmp((pvVar6->_M_dataplus)._M_p,local_68,__n);
        if (iVar4 != 0) goto LAB_0010add2;
      }
      pvVar6 = std::
               get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar7->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
      (this->shadingModel)._M_dataplus._M_p = (pointer)&(this->shadingModel).field_2;
      pcVar2 = (pvVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&this->shadingModel,pcVar2,pcVar2 + pvVar6->_M_string_length);
      goto LAB_0010ae26;
    }
LAB_0010add2:
    pNVar7 = pNVar7 + 1;
  } while( true );
}

Assistant:

explicit Material(const Node &node) :
                Object(std::get<int64_t>(node.properties[0])),
                shadingModel(getProperty<std::string>(node, "ShadingModel", "phong")),
                emissiveFactor(getProperty(node, "EmissiveFactor", 0.0)),
                ambientColor(getProperty(node, "AmbientColor", {})),
                diffuseColor(getProperty(node, "DiffuseColor", {})),
                transparentColor(getProperty(node, "TransparentColor", {})),
                specularColor(getProperty(node, "SpecularColor", {})),
                shininessExponent(getProperty(node, "ShininessExponent", 2.0)),
                emissive(getProperty(node, "Emissive", {})),
                ambient(getProperty(node, "Ambient", {})),
                diffuse(getProperty(node, "Diffuse", {})),
                specular(getProperty(node, "Specular", {})),
                shininess(getProperty(node, "Shininess", 2.0)),
                opacity(getProperty(node, "Opacity", 1.0)),
                reflectivity(getProperty(node, "Reflectivity", 0.0)) {}